

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_lastIndexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue op1;
  ulong uVar1;
  int iVar2;
  BOOL BVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  ulong idx;
  bool bVar6;
  JSValue JVar7;
  int64_t len;
  JSValue val;
  ulong local_50;
  long local_48;
  JSValue local_40;
  
  JVar7 = JS_ToObject(ctx,this_val);
  JVar4 = JVar7.u;
  iVar2 = js_get_length64(ctx,&local_48,JVar7);
  idx = local_50;
  if (iVar2 == 0) {
    if (local_48 < 1) {
      idx = 0xffffffffffffffff;
      uVar1 = local_50;
    }
    else {
      local_50 = local_48 - 1;
      if ((1 < argc) &&
         (iVar2 = JS_ToInt64Clamp(ctx,(int64_t *)&local_50,argv[1],-1,local_50,local_48),
         idx = local_50, iVar2 != 0)) goto LAB_00166397;
      if (-1 < (long)local_50) {
        idx = local_50;
        do {
          iVar2 = JS_TryGetPropertyInt64(ctx,JVar7,idx,&local_40);
          if (iVar2 < 0) goto LAB_00166397;
          if (iVar2 != 0) {
            op1 = *argv;
            if (0xfffffff4 < (uint)argv->tag) {
              *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
            }
            BVar3 = js_strict_eq2(ctx,op1,local_40,JS_EQ_STRICT);
            uVar1 = idx;
            if (BVar3 != 0) goto LAB_0016649d;
          }
          bVar6 = 0 < (long)idx;
          idx = idx - 1;
        } while (bVar6);
        local_50 = 0xffffffffffffffff;
      }
      idx = 0xffffffffffffffff;
      uVar1 = local_50;
    }
LAB_0016649d:
    local_50 = uVar1;
    if ((0xfffffff4 < (uint)JVar7.tag) &&
       (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar7);
    }
    bVar6 = (long)(int)idx == idx;
    JVar4.float64 = (double)(long)idx;
    if (bVar6) {
      JVar4.ptr = (void *)(idx & 0xffffffff);
    }
    iVar5 = 7;
    if (bVar6) {
      iVar5 = 0;
    }
  }
  else {
LAB_00166397:
    local_50 = idx;
    if ((0xfffffff4 < (uint)JVar7.tag) &&
       (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar7);
    }
    JVar4.float64 = 0.0;
    iVar5 = 6;
  }
  JVar7.tag = iVar5;
  JVar7.u.float64 = JVar4.float64;
  return JVar7;
}

Assistant:

static JSValue js_array_lastIndexOf(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    int present;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = len - 1;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], -1, len - 1, len))
                goto exception;
        }
        /* XXX: should special case fast arrays */
        for (; n >= 0; n--) {
            present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}